

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O3

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::_relax
          (WeightedDigraphSPAcyclic<int,_int> *this,WeightedDigraph<int,_int> *graph,Node *node)

{
  int iVar1;
  int iVar2;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar4;
  pointer pWVar5;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar6;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar7;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar8;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar9;
  out_of_range *poVar10;
  int iVar11;
  pointer pWVar12;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar13;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar14;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  edges;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *local_98;
  size_t local_90;
  size_t local_88;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  local_68;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *local_48;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRStack_40;
  pointer local_38;
  
  pLVar6 = (this->_weight_to)._list._header;
  do {
    pLVar6 = pLVar6->_next;
    if (pLVar6 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      poVar10 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar10,"Key error, no such key in this table !");
      __cxa_throw(poVar10,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  } while ((pLVar6->element).key != (node->element).key);
  iVar1 = (pLVar6->element).value;
  local_68.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar13 = (node->element).value._table._list._header;
  while (pWVar5 = local_68.
                  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, pLVar13 = pLVar13->_next,
        pLVar13 !=
        (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
    std::
    vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
    ::push_back(&local_68,&(pLVar13->element).value);
  }
  local_38 = local_68.
             super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.
      super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_68.
      super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001073cc:
    if (pWVar5 != (pointer)0x0) {
      operator_delete(pWVar5,(long)local_68.
                                   super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pWVar5
                     );
    }
    return;
  }
  pLVar6 = (this->_weight_to)._list._header;
  pLVar3 = (this->_edge_to)._list._header;
  local_98 = (this->_edge_to)._list._tail;
  pLVar14 = (this->_weight_to)._list._tail;
  local_88 = (this->_weight_to)._list._size;
  local_90 = (this->_edge_to)._list._size;
  pWVar12 = local_68.
            super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
LAB_001071f7:
  iVar2 = (pWVar12->to->element).key;
  iVar11 = pWVar12->weight + iVar1;
  pLVar8 = pLVar6;
  do {
    pLVar8 = pLVar8->_next;
    pLVar7 = pLVar6;
    pLVar9 = pLVar3;
    if (pLVar8 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0)
    goto LAB_00107259;
  } while ((pLVar8->element).key != iVar2);
  do {
    pLVar7 = pLVar7->_next;
    if (pLVar7 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      poVar10 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar10,"Key error, no such key in this table !");
      __cxa_throw(poVar10,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  } while ((pLVar7->element).key != iVar2);
  pLVar8 = pLVar6;
  if (iVar11 < (pLVar7->element).value) {
    do {
      pLVar8 = pLVar8->_next;
      if (pLVar8 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
        pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
        pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cbd8;
        (pLVar8->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cc08
        ;
        (pLVar8->element).key = iVar2;
        (pLVar8->element).value = iVar11;
        pLVar8->_next = pLVar14->_next;
        pLVar14->_next = pLVar8;
        local_88 = local_88 + 1;
        (this->_weight_to)._list._size = local_88;
        (this->_weight_to)._list._tail = pLVar8;
        pLVar14 = pLVar8;
        goto LAB_00107338;
      }
    } while ((pLVar8->element).key != iVar2);
    (pLVar8->element).value = iVar11;
LAB_00107338:
    pLVar9 = pLVar9->_next;
    if (pLVar9 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) goto code_r0x00107341;
    local_48 = pWVar12->from;
    pRStack_40 = pWVar12->to;
    iVar11 = pWVar12->weight;
    pLVar9 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
              *)operator_new(0x38);
LAB_0010736f:
    pLVar9->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cb18;
    (pLVar9->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cb48;
    (pLVar9->element).key = iVar2;
    (pLVar9->element).value.from = local_48;
    (pLVar9->element).value.to = pRStack_40;
    (pLVar9->element).value.weight = iVar11;
    pLVar9->_next = local_98->_next;
    local_98->_next = pLVar9;
    local_90 = local_90 + 1;
    (this->_edge_to)._list._size = local_90;
    (this->_edge_to)._list._tail = pLVar9;
    local_98 = pLVar9;
  }
  goto LAB_001073bd;
  while ((pLVar7->element).key != iVar2) {
LAB_00107259:
    pLVar7 = pLVar7->_next;
    if (pLVar7 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
      pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cbd8;
      (pLVar8->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cc08;
      (pLVar8->element).key = iVar2;
      (pLVar8->element).value = iVar11;
      pLVar8->_next = pLVar14->_next;
      pLVar14->_next = pLVar8;
      local_88 = local_88 + 1;
      (this->_weight_to)._list._size = local_88;
      (this->_weight_to)._list._tail = pLVar8;
      pLVar14 = pLVar8;
      goto LAB_001072bc;
    }
  }
  (pLVar7->element).value = iVar11;
LAB_001072bc:
  do {
    pLVar9 = pLVar9->_next;
    if (pLVar9 == (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      local_48 = pWVar12->from;
      pRStack_40 = pWVar12->to;
      iVar11 = pWVar12->weight;
      pLVar9 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                *)operator_new(0x38);
      goto LAB_0010736f;
    }
  } while ((pLVar9->element).key != iVar2);
LAB_00107347:
  pRVar4 = pWVar12->to;
  (pLVar9->element).value.from = pWVar12->from;
  (pLVar9->element).value.to = pRVar4;
  (pLVar9->element).value.weight = pWVar12->weight;
LAB_001073bd:
  pWVar12 = pWVar12 + 1;
  if (pWVar12 == local_38) goto LAB_001073cc;
  goto LAB_001071f7;
code_r0x00107341:
  if ((pLVar9->element).key == iVar2) goto LAB_00107347;
  goto LAB_00107338;
}

Assistant:

void _relax(WeightedDigraph<T, Weight> &graph, Node* node) {
            auto vertex = node->element.key;
            auto weight = _weight_to.get(vertex);
            auto edges = node->element.value.adjEdges();
            for (auto &edge: edges) {
                auto to_vertex = edge.to->element.key;
                auto new_weight = weight + edge.weight;
                if (!_weight_to.has(to_vertex)) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                    continue;
                }
                if (_weight_to.get(to_vertex) > new_weight) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                }
            }
        }